

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTCPSDESInfo::GetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  
  p_Var4 = (_List_node_base *)&this->privitems;
  do {
    p_Var4 = (((_List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar3 = false;
    do {
      if (bVar3) {
        lVar1 = (long)p_Var4[1]._M_next;
        *valuelen = *(size_t *)(lVar1 + 0x18);
        *value = *(uint8_t **)(lVar1 + 0x10);
        return bVar3;
      }
      if (p_Var4 == (_List_node_base *)&this->privitems) {
        return bVar3;
      }
    } while ((*(size_t *)((long)p_Var4[1]._M_next + 0x28) == prefixlen) &&
            ((bVar3 = true, prefixlen == 0 ||
             (iVar2 = bcmp(prefix,*(void **)((long)p_Var4[1]._M_next + 0x20),prefixlen), iVar2 == 0)
             )));
  } while( true );
}

Assistant:

bool RTCPSDESInfo::GetPrivateValue(const uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen) const
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (found)
		*value = (*it)->GetInfo(valuelen);
	return found;
}